

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  char *buffer;
  char *pcVar5;
  ulong srcSize;
  char *pcStack_70;
  uint local_64;
  char *local_60;
  uint local_54;
  short *local_50;
  size_t local_48;
  char *local_40;
  void *local_38;
  
  if (workspaceSize < 0x2c0) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace + 0x1b4) = 0;
  uVar1 = huffLog + 1;
  for (lVar4 = 0x1b5; lVar4 - 0x1b4U < (ulong)uVar1; lVar4 = lVar4 + 1) {
    *(char *)((long)workspace + lVar4) = (char)huffLog;
    huffLog = (uint)(byte)((char)huffLog - 1);
  }
  local_38 = (void *)((long)workspace + 0x1c1);
  srcSize = (ulong)maxSymbolValue;
  for (uVar2 = 0; srcSize != uVar2; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)workspace + uVar2 + 0x1c1) =
         *(undefined1 *)((long)workspace + (ulong)CTable[uVar2].nbBits + 0x1b4);
  }
  buffer = (char *)((long)dst + 1);
  local_64 = 0xc;
  if (maxSymbolValue < 2) {
    pcVar5 = (char *)0x0;
  }
  else {
    local_60 = (char *)maxDstSize;
    uVar1 = HIST_count_simple((uint *)((long)workspace + 0x164),&local_64,local_38,srcSize);
    if (uVar1 == maxSymbolValue) {
      pcVar5 = (char *)0x1;
      maxDstSize = (size_t)local_60;
    }
    else {
      if (uVar1 != 1) {
        local_54 = FSE_optimalTableLog(6,srcSize,local_64);
        local_50 = (short *)((long)workspace + 0x198);
        sVar3 = FSE_normalizeCount(local_50,local_54,(uint *)((long)workspace + 0x164),srcSize,
                                   local_64,0);
        uVar1 = local_54;
        if (0xffffffffffffff88 < sVar3) {
          return sVar3;
        }
        local_40 = local_60 + -1;
        local_48 = FSE_writeNCount(buffer,(size_t)local_40,local_50,local_64,local_54);
        if (0xffffffffffffff88 < local_48) {
          return local_48;
        }
        sVar3 = FSE_buildCTable_wksp
                          ((FSE_CTable *)workspace,local_50,local_64,uVar1,
                           (void *)((long)workspace + 0xec),0x78);
        if (0xffffffffffffff88 < sVar3) {
          return sVar3;
        }
        pcVar5 = buffer + local_48;
        sVar3 = FSE_compress_usingCTable
                          (pcVar5,(long)local_40 - local_48,local_38,srcSize,(FSE_CTable *)workspace
                          );
        if (0xffffffffffffff88 < sVar3) {
          return sVar3;
        }
        if (sVar3 != 0) {
          pcVar5 = pcVar5 + (sVar3 - (long)buffer);
          maxDstSize = (size_t)local_60;
          if ((char *)0xffffffffffffff88 < pcVar5) {
            return (size_t)pcVar5;
          }
          goto LAB_002042ff;
        }
      }
      pcVar5 = (char *)0x0;
      maxDstSize = (size_t)local_60;
    }
  }
LAB_002042ff:
  pcStack_70 = (char *)0xffffffffffffffff;
  if (pcVar5 < (char *)(ulong)(maxSymbolValue >> 1) && (char *)0x1 < pcVar5) {
    *(char *)dst = (char)pcVar5;
    pcStack_70 = pcVar5 + 1;
  }
  else if (maxSymbolValue < 0x81) {
    pcStack_70 = (char *)(ulong)((maxSymbolValue + 1 >> 1) + 1);
    if (maxDstSize < pcStack_70) {
      pcStack_70 = (char *)0xffffffffffffffba;
    }
    else {
      *(char *)dst = (char)maxSymbolValue + '\x7f';
      *(undefined1 *)((long)workspace + srcSize + 0x1c1) = 0;
      for (uVar2 = 0; uVar2 < srcSize; uVar2 = uVar2 + 2) {
        *buffer = *(char *)((long)workspace + uVar2 + 0x1c1) * '\x10' +
                  *(char *)((long)workspace + uVar2 + 0x1c2);
        buffer = buffer + 1;
      }
    }
  }
  return (size_t)pcStack_70;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)workspace;

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}